

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int DisconnectSBGx(SBG *pSBG)

{
  int iVar1;
  int local_1c;
  int res;
  int id;
  SBG *pSBG_local;
  
  local_1c = 0;
  do {
    if ((SBG *)addrsSBG[local_1c] == pSBG) {
      iVar1 = DisconnectSBG(pSBG);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSBG[local_1c] = (void *)0x0;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectSBGx(SBG* pSBG)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectSBG(pSBG);
	if (res != EXIT_SUCCESS) return res;

	addrsSBG[id] = NULL;

	return EXIT_SUCCESS;
}